

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

unsigned_long
getU<unsigned_long>(uint64_t *offset_ptr,DataExtractor *de,bool isLittleEndian,char *Data,Error *Err
                   )

{
  uint64_t offset_00;
  bool bVar1;
  uint64_t offset;
  uint64_t *local_48;
  unsigned_long val;
  ErrorAsOutParameter ErrAsOut;
  Error *Err_local;
  char *Data_local;
  bool isLittleEndian_local;
  DataExtractor *de_local;
  uint64_t *offset_ptr_local;
  
  ErrAsOut.Err = Err;
  llvm::ErrorAsOutParameter::ErrorAsOutParameter((ErrorAsOutParameter *)&val,Err);
  local_48 = (uint64_t *)0x0;
  bVar1 = isError(ErrAsOut.Err);
  if (bVar1) {
    offset_ptr_local = local_48;
  }
  else {
    offset_00 = *offset_ptr;
    bVar1 = llvm::DataExtractor::isValidOffsetForDataOfSize(de,offset_00,8);
    if (bVar1) {
      local_48 = *(uint64_t **)(Data + offset_00);
      if (!isLittleEndian) {
        llvm::sys::swapByteOrder<unsigned_long>((unsigned_long *)&local_48);
      }
      *offset_ptr = *offset_ptr + 8;
      offset_ptr_local = local_48;
    }
    else {
      unexpectedEndReached(ErrAsOut.Err);
      offset_ptr_local = local_48;
    }
  }
  local_48 = offset_ptr_local;
  llvm::ErrorAsOutParameter::~ErrorAsOutParameter((ErrorAsOutParameter *)&val);
  return (unsigned_long)offset_ptr_local;
}

Assistant:

static T getU(uint64_t *offset_ptr, const DataExtractor *de,
              bool isLittleEndian, const char *Data, llvm::Error *Err) {
  ErrorAsOutParameter ErrAsOut(Err);
  T val = 0;
  if (isError(Err))
    return val;

  uint64_t offset = *offset_ptr;
  if (!de->isValidOffsetForDataOfSize(offset, sizeof(T))) {
    unexpectedEndReached(Err);
    return val;
  }
  std::memcpy(&val, &Data[offset], sizeof(val));
  if (sys::IsLittleEndianHost != isLittleEndian)
    sys::swapByteOrder(val);

  // Advance the offset
  *offset_ptr += sizeof(val);
  return val;
}